

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O1

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  tm *stm;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char cc [4];
  time_t t;
  size_t slen;
  tm tmr;
  luaL_Buffer b;
  char local_4b4;
  undefined1 local_4b3 [3];
  lua_Integer local_4b0;
  tm *local_4a8;
  char *local_4a0;
  char *local_498;
  size_t local_490;
  tm local_488;
  luaL_Buffer local_450;
  
  __s1 = luaL_optlstring(L,1,"%c",&local_490);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    local_4b0 = time((time_t *)0x0);
  }
  else {
    local_4b0 = luaL_checkinteger(L,2);
  }
  pcVar4 = __s1 + local_490;
  if (*__s1 == '!') {
    stm = (tm *)gmtime_r(&local_4b0,&local_488);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime_r(&local_4b0,&local_488);
  }
  if (stm == (tm *)0x0) {
    iVar2 = luaL_error(L,"date result cannot be represented in this installation");
  }
  else {
    iVar2 = strcmp(__s1,"*t");
    if (iVar2 == 0) {
      lua_createtable(L,0,9);
      setallfields(L,stm);
    }
    else {
      local_4b4 = '%';
      luaL_buffinit(L,&local_450);
      pcVar6 = pcVar4;
      if (__s1 < pcVar4) {
        do {
          local_4a0 = pcVar6;
          local_4a8 = stm;
          if (*__s1 == '%') {
            local_498 = luaL_prepbuffsize(&local_450,0xfa);
            __s1 = __s1 + 1;
            if (0 < (long)pcVar4 - (long)__s1) {
              iVar2 = 1;
              cVar1 = 'a';
              sVar5 = 1;
              pcVar6 = 
              "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
              do {
                if (cVar1 == '|') {
                  iVar2 = iVar2 + 1;
                }
                else {
                  iVar3 = bcmp(__s1,pcVar6,sVar5);
                  if (iVar3 == 0) {
                    memcpy(local_4b3,__s1,sVar5);
                    local_4b3[sVar5] = 0;
                    __s1 = __s1 + sVar5;
                    goto LAB_0011a3ba;
                  }
                }
                sVar5 = (size_t)iVar2;
                cVar1 = pcVar6[sVar5];
              } while ((cVar1 != '\0') &&
                      (pcVar6 = pcVar6 + sVar5, (long)sVar5 <= (long)pcVar4 - (long)__s1));
            }
            pcVar4 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
            luaL_argerror(L,1,pcVar4);
LAB_0011a3ba:
            sVar5 = strftime(local_498,0xfa,&local_4b4,(tm *)local_4a8);
            pcVar4 = local_4a0;
            local_450.n = local_450.n + sVar5;
          }
          else {
            if (local_450.size <= local_450.n) {
              luaL_prepbuffsize(&local_450,1);
            }
            cVar1 = *__s1;
            __s1 = __s1 + 1;
            local_450.b[local_450.n] = cVar1;
            local_450.n = local_450.n + 1;
          }
          stm = local_4a8;
          pcVar6 = local_4a0;
        } while (__s1 < pcVar4);
      }
      luaL_pushresult(&local_450);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int os_date (lua_State *L) {
  size_t slen;
  const char *s = luaL_optlstring(L, 1, "%c", &slen);
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  const char *se = s + slen;  /* 's' end */
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    return luaL_error(L,
                 "date result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (s < se) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s++;  /* skip '%' */
        s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}